

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string_view value;
  string_view value_00;
  bool bVar1;
  element_type *this;
  ostream *poVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  element_type *peVar7;
  shared_ptr<mini_bus::ConnectionInfo> *this_00;
  string_view payload;
  string_view bucket;
  string_view bucket_00;
  string_view bucket_01;
  string_view bucket_02;
  string_view bucket_03;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  exception *e;
  basic_string_view<char,_std::char_traits<char>_> local_1918;
  basic_string_view<char,_std::char_traits<char>_> local_1908;
  basic_string_view<char,_std::char_traits<char>_> local_18f8;
  undefined1 local_18e8 [136];
  NotifyToken<int> tok_1;
  basic_string_view<char,_std::char_traits<char>_> local_17e8;
  undefined1 local_17d8 [56];
  undefined1 local_17a0 [8];
  NotifyToken<int> tok;
  function<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>)> local_1728;
  basic_string_view<char,_std::char_traits<char>_> local_1708;
  basic_string_view<char,_std::char_traits<char>_> local_16f8;
  undefined8 local_16e8;
  type *v;
  type *k;
  _Self local_16d0;
  iterator __end1;
  iterator __begin1;
  undefined1 local_16b0 [48];
  list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  basic_string_view<char,_std::char_traits<char>_> local_1670;
  undefined1 local_1660 [56];
  basic_string_view<char,_std::char_traits<char>_> local_1628;
  basic_string_view<char,_std::char_traits<char>_> local_1618;
  basic_string_view<char,_std::char_traits<char>_> local_1608;
  undefined1 local_15f8 [24];
  string local_15e0 [48];
  undefined1 local_15b0 [24];
  function<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>)> local_1598;
  basic_string_view<char,_std::char_traits<char>_> local_1578;
  basic_string_view<char,_std::char_traits<char>_> local_1568;
  shared_ptr<mini_bus::ConnectionInfo> local_1558;
  undefined1 local_1548 [8];
  MiniBusClient client;
  basic_endpoint<boost::asio::ip::tcp> local_64;
  undefined1 local_48 [8];
  shared_ptr<mini_bus::BasicConnectionInfo> info;
  undefined1 local_28 [8];
  io_service service;
  char **argv_local;
  int argc_local;
  
  service.impl_ = (impl_type *)argv;
  boost::asio::io_context::io_context((io_context *)local_28);
  boost::asio::ip::address::from_string((address *)&client.work_thread,"127.0.0.1");
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&local_64,(address *)&client.work_thread,0xfc8);
  std::
  make_shared<mini_bus::BasicConnectionInfo,boost::asio::io_context&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
            ((io_context *)local_48,(basic_endpoint<boost::asio::ip::tcp> *)local_28);
  this_00 = &local_1558;
  std::shared_ptr<mini_bus::ConnectionInfo>::shared_ptr<mini_bus::BasicConnectionInfo,void>
            (this_00,(shared_ptr<mini_bus::BasicConnectionInfo> *)local_48);
  mini_bus::MiniBusClient::MiniBusClient((MiniBusClient *)local_1548,this_00);
  std::shared_ptr<mini_bus::ConnectionInfo>::~shared_ptr(&local_1558);
  this = std::
         __shared_ptr_access<mini_bus::BasicConnectionInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<mini_bus::BasicConnectionInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_48);
  mini_bus::BasicConnectionInfo::wait(this,this_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"connected");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1568,"shared");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1578,"key");
  std::function<void(std::optional<std::basic_string_view<char,std::char_traits<char>>>)>::
  function<main::__0,void>
            ((function<void(std::optional<std::basic_string_view<char,std::char_traits<char>>>)> *)
             &local_1598,(anon_class_1_0_00000001 *)(local_15b0 + 0x17));
  mini_bus::MiniBusClient::observe((MiniBusClient *)local_1548,local_1568,local_1578,&local_1598);
  std::function<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>)>::
  ~function(&local_1598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_15e0,0x400,'a',(allocator<char> *)(local_15f8 + 0x17));
  local_15e0._32_16_ = std::__cxx11::string::operator_cast_to_basic_string_view(local_15e0);
  payload._M_str = local_15e0._32_8_;
  payload._M_len = (size_t)local_1548;
  mini_bus::MiniBusClient::ping((MiniBusClient *)local_15b0,payload);
  peVar3 = std::
           __shared_ptr_access<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mini_bus::IBaseNotifyToken<bool>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_15b0);
  (*peVar3->_vptr_IBaseNotifyToken[2])();
  std::shared_ptr<mini_bus::IBaseNotifyToken<bool>_>::~shared_ptr
            ((shared_ptr<mini_bus::IBaseNotifyToken<bool>_> *)local_15b0);
  std::__cxx11::string::~string(local_15e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_15f8 + 0x17));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1608,"shared");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1618,"key");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1628,"value");
  value._M_str = local_1628._M_str;
  value._M_len = local_1628._M_len;
  bucket._M_str = (char *)local_1608._M_len;
  bucket._M_len = (size_t)local_1548;
  key._M_str = (char *)local_1618._M_len;
  key._M_len = (size_t)local_1608._M_str;
  mini_bus::MiniBusClient::set((MiniBusClient *)local_15f8,bucket,key,value);
  peVar4 = std::
           __shared_ptr_access<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mini_bus::IBaseNotifyToken<void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_15f8);
  (*peVar4->_vptr_IBaseNotifyToken[2])();
  std::shared_ptr<mini_bus::IBaseNotifyToken<void>_>::~shared_ptr
            ((shared_ptr<mini_bus::IBaseNotifyToken<void>_> *)local_15f8);
  poVar2 = std::operator<<((ostream *)&std::cout,"v: ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1670,"shared");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range1,"key");
  bucket_00._M_str = (char *)local_1670._M_len;
  bucket_00._M_len = (size_t)local_1548;
  key_00._M_str = (char *)__range1;
  key_00._M_len = (size_t)local_1670._M_str;
  mini_bus::MiniBusClient::get_abi_cxx11_((MiniBusClient *)local_1660,bucket_00,key_00);
  peVar5 = std::
           __shared_ptr_access<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1660);
  (*peVar5->_vptr_IBaseNotifyToken[2])(local_1660 + 0x10);
  pbVar6 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_1660 + 0x10));
  poVar2 = std::operator<<(poVar2,(string *)pbVar6);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_1660 + 0x10));
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1660);
  poVar2 = std::operator<<((ostream *)&std::cout,"here");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__begin1,"shared");
  bucket_01._M_str = (char *)__begin1._M_node;
  bucket_01._M_len = (size_t)local_1548;
  mini_bus::MiniBusClient::keys_abi_cxx11_((MiniBusClient *)local_16b0,bucket_01);
  peVar7 = std::
           __shared_ptr_access<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_16b0);
  (*peVar7->_vptr_IBaseNotifyToken[2])(local_16b0 + 0x10);
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::__cxx11::list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_16b0);
  local_16b0._40_8_ = local_16b0 + 0x10;
  __end1 = std::__cxx11::
           list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_16b0._40_8_);
  local_16d0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_16b0._40_8_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_16d0);
    if (!bVar1) break;
    k = (type *)std::
                _List_iterator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1);
    v = (type *)std::get<0ul,mini_bus::MiniBusClient::ACL,std::__cxx11::string>
                          ((tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)k);
    local_16e8 = std::get<1ul,mini_bus::MiniBusClient::ACL,std::__cxx11::string>
                           ((tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)k);
    poVar2 = std::operator<<((ostream *)&std::cout,"kv: ");
    poVar2 = std::operator<<(poVar2,(string *)local_16e8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)v);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    _List_iterator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::
  list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~list((list<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<mini_bus::MiniBusClient::ACL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)(local_16b0 + 0x10));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_16f8,"demo");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1708,"event");
  std::function<void(std::optional<std::basic_string_view<char,std::char_traits<char>>>)>::
  function<main::__1,void>
            ((function<void(std::optional<std::basic_string_view<char,std::char_traits<char>>>)> *)
             &local_1728,(anon_class_1_0_00000001 *)((long)&tok.ex._M_exception_object + 7));
  mini_bus::MiniBusClient::listen
            ((MiniBusClient *)local_1548,(undefined4)local_16f8._M_len,local_16f8._M_str._0_4_);
  std::function<void_(std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>)>::
  ~function(&local_1728);
  mini_bus::NotifyToken<int>::NotifyToken((NotifyToken<int> *)local_17a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_17e8,"registry");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&tok_1.ex,"demo");
  bucket_02._M_str = (char *)local_17e8._M_len;
  bucket_02._M_len = (size_t)local_1548;
  key_01._M_str = (char *)tok_1.ex._M_exception_object;
  key_01._M_len = (size_t)local_17e8._M_str;
  mini_bus::MiniBusClient::get_abi_cxx11_((MiniBusClient *)local_17d8,bucket_02,key_01);
  peVar5 = std::
           __shared_ptr_access<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_17d8);
  (*peVar5->_vptr_IBaseNotifyToken[2])(local_17d8 + 0x10);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_17d8 + 0x10));
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_17d8);
  poVar2 = std::operator<<((ostream *)&std::cout,"call");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_18f8,"demo");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1908,"echo");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1918,"boom");
  value_00._M_str = local_1918._M_str;
  value_00._M_len = local_1918._M_len;
  bucket_03._M_str = (char *)local_18f8._M_len;
  bucket_03._M_len = (size_t)local_1548;
  key_02._M_str = (char *)local_1908._M_len;
  key_02._M_len = (size_t)local_18f8._M_str;
  mini_bus::MiniBusClient::call_abi_cxx11_((MiniBusClient *)local_18e8,bucket_03,key_02,value_00);
  peVar5 = std::
           __shared_ptr_access<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18e8);
  (*peVar5->_vptr_IBaseNotifyToken[2])(local_18e8 + 0x10);
  pbVar6 = std::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_18e8 + 0x10));
  poVar2 = std::operator<<(poVar2,(string *)pbVar6);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_18e8 + 0x10));
  std::
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_18e8);
  e = (exception *)s<(char)49,(char)48>();
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>((duration<long,_std::ratio<1L,_1L>_> *)&e);
  mini_bus::NotifyToken<int>::~NotifyToken((NotifyToken<int> *)local_17a0);
  mini_bus::MiniBusClient::~MiniBusClient((MiniBusClient *)local_1548);
  std::shared_ptr<mini_bus::BasicConnectionInfo>::~shared_ptr
            ((shared_ptr<mini_bus::BasicConnectionInfo> *)local_48);
  boost::asio::io_context::~io_context((io_context *)local_28);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace mini_bus;
  using namespace std::chrono_literals;
  try {
    io_service service;
    auto info =
        std::make_shared<BasicConnectionInfo>(service, ip::tcp::endpoint{ip::address::from_string("127.0.0.1"), 4040});
    MiniBusClient client{info};
    info->wait();
    std::cout << "connected" << std::endl;

    client.observe("shared", "key", [](auto sv) {
      if (sv) std::cout << "update: " << *sv << std::endl;
    });

    client.ping(std::string(1024, 'a'))->wait();
    client.set("shared", "key", "value")->wait();
    std::cout << "v: " << *client.get("shared", "key")->wait() << std::endl;

    std::cout << "here" << std::endl;

    for (auto &[k, v] : client.keys("shared")->wait()) { std::cout << "kv: " << v << (int) k << std::endl; }

    client.listen("demo", "event", [](auto data) {
      if (data) std::cout << "event: " << *data << std::endl;
    });

    NotifyToken<int> tok;

    try {
      client.get("registry", "demo")->wait();
    } catch (...) {
      std::cout << "waiting" << std::endl;
      NotifyToken<int> tok;
      client.observe("registry", "demo", [&](auto sv) { tok.notify(0); });
      tok.wait();
    }

    std::cout << "call" << *client.call("demo", "echo", "boom")->wait() << std::endl;

    std::this_thread::sleep_for(10s);
  } catch (std::exception &e) { std::cout << e.what() << std::endl; }
}